

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::String::Replace(String *this,int pos,int len,char *s,uchar fill)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uchar *puVar4;
  long lVar5;
  tagbstring t;
  String local_50;
  tagbstring local_40;
  
  if ((this->super_tagbstring).mlen < 1) {
    Replace();
  }
  if (-1 < (len | pos) && s != (char *)0x0) {
    uVar1 = (this->super_tagbstring).slen;
    if (len + pos < (int)uVar1) {
      puVar4 = (this->super_tagbstring).data;
      if ((uint)((int)puVar4 - (int)s) < uVar1) {
        String(&local_50,s);
        Replace(this,pos,len,&local_50,fill);
        if (local_50.super_tagbstring.data != (uchar *)0x0) {
          free(local_50.super_tagbstring.data);
        }
      }
      else {
        sVar3 = strlen(s);
        iVar2 = (int)sVar3;
        if (len < iVar2) {
          Alloc(this,(uVar1 - len) + iVar2);
          puVar4 = (this->super_tagbstring).data;
          if (puVar4 == (uchar *)0x0) {
            return;
          }
        }
        if (iVar2 - len != 0) {
          memmove(puVar4 + (long)iVar2 + (long)pos,puVar4 + (long)len + (long)pos,
                  (long)(this->super_tagbstring).slen - (long)(len + pos));
          puVar4 = (this->super_tagbstring).data;
        }
        memcpy(puVar4 + pos,s,(long)iVar2);
        lVar5 = (long)(iVar2 - len) + (long)(this->super_tagbstring).slen;
        (this->super_tagbstring).slen = (int)lVar5;
        (this->super_tagbstring).data[lVar5] = '\0';
      }
    }
    else {
      local_40.data = (uchar *)s;
      sVar3 = strlen(s);
      local_40.slen = (int)sVar3;
      local_40.mlen = -1;
      iVar2 = bsetstr(&this->super_tagbstring,pos,&local_40,fill);
      if (iVar2 == -1) {
        Replace();
      }
      else {
        iVar2 = (int)((long)pos + (long)local_40.slen);
        if (iVar2 < (this->super_tagbstring).slen) {
          (this->super_tagbstring).slen = iVar2;
          (this->super_tagbstring).data[(long)pos + (long)local_40.slen] = '\0';
        }
      }
    }
  }
  return;
}

Assistant:

void String::Replace(int pos, int len, const char * s, unsigned char fill)
    {
        struct tagbstring t;
        int q;

        if (mlen <= 0)                        bstringThrow("Write protection error");
        if (NULL == s || (pos | len) < 0)    return;


        if (pos + len >= slen)
        {
            cstr2tbstr(t, s);
            if (BSTR_ERR == bsetstr(this, pos, &t, fill))
                bstringThrow("Failure in Replace");
            else if (pos + t.slen < slen)
            {
                slen = pos + t.slen;
                data[slen] = '\0';
            }
        }
        else
        {
            /* Aliasing case */
            if ((unsigned int)(data - (uint8 * ) s) < (unsigned int) slen)
            {
                Replace(pos, len, String(s), fill);
                return;
            }

            if ((q = (int)strlen(s)) > len)
            {
                Alloc(slen + q - len);
                if (NULL == data)    return;
            }
            if (q != len) memmove(data + pos + q, data + pos + len, slen - (pos + len));
            memcpy(data + pos, s, q);
            slen += q - len;
            data[slen] = '\0';
        }
    }